

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_coding.h
# Opt level: O0

uint32_t half_to_float_int(uint16_t hv)

{
  float fVar1;
  anon_union_4_2_947300a4 v;
  
  fVar1 = half_to_float(0);
  return (uint32_t)fVar1;
}

Assistant:

static inline uint32_t
half_to_float_int (uint16_t hv)
{
    union
    {
        uint32_t i;
        float    f;
    } v;
    v.f = half_to_float (hv);
    return v.i;
}